

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::SlidingWindowsLayerParams::MergePartialFromCodedStream
          (SlidingWindowsLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  unsigned_long uVar6;
  uint8 *puVar7;
  char cVar8;
  ulong uVar9;
  pair<unsigned_long,_bool> pVar10;
  
LAB_00143059:
  pbVar2 = input->buffer_;
  uVar4 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar4 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_0014307c;
    input->buffer_ = pbVar2 + 1;
    uVar9 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_0014307c:
    uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
    uVar9 = 0;
    if (uVar4 - 1 < 0x7f) {
      uVar9 = 0x100000000;
    }
    uVar9 = uVar4 | uVar9;
  }
  uVar4 = (uint32)uVar9;
  if ((uVar9 & 0x100000000) != 0) {
    uVar5 = (uint)(uVar9 >> 3) & 0x1fffffff;
    cVar8 = (char)uVar9;
    if (uVar5 == 3) {
      if (cVar8 != '\x18') goto LAB_0014309d;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (-1 < (long)(char)*puVar7)) {
        this->step_ = (long)(char)*puVar7;
        goto LAB_00143138;
      }
      pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->step_ = pVar10.first;
LAB_0014315d:
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
      goto LAB_00143059;
    }
    if (uVar5 == 2) {
      if (cVar8 != '\x10') goto LAB_0014309d;
      puVar7 = input->buffer_;
      if ((input->buffer_end_ <= puVar7) || ((long)(char)*puVar7 < 0)) {
        pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->windowsize_ = pVar10.first;
        goto LAB_0014315d;
      }
      this->windowsize_ = (long)(char)*puVar7;
LAB_00143138:
      input->buffer_ = puVar7 + 1;
      goto LAB_00143059;
    }
    if ((uVar5 == 1) && (cVar8 == '\b')) {
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (uVar6 = (unsigned_long)(char)*puVar7, -1 < (long)uVar6))
      {
        input->buffer_ = puVar7 + 1;
      }
      else {
        pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar6 = pVar10.first;
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->axis_ = uVar6;
      goto LAB_00143059;
    }
  }
LAB_0014309d:
  if (uVar4 == 0) {
    return true;
  }
  if ((uVar4 & 7) == 4) {
    return true;
  }
  bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
  if (!bVar3) {
    return false;
  }
  goto LAB_00143059;
}

Assistant:

bool SlidingWindowsLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SlidingWindowsLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 axis = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 windowSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &windowsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 step = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &step_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SlidingWindowsLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SlidingWindowsLayerParams)
  return false;
#undef DO_
}